

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O2

bool __thiscall ON_Hatch::ReplaceLoops(ON_Hatch *this,ON_SimpleArray<const_ON_Curve_*> *loop_curves)

{
  ON_HatchLoop **__s;
  int iVar1;
  ON_SimpleArray<const_ON_Curve_*> *pCurve2d;
  ON_HatchLoop *pOVar2;
  long lVar3;
  ON_SimpleArray<const_ON_Curve_*> *x;
  ON_Plane *pOVar4;
  ON_Xform *pOVar5;
  ON_Plane *pOVar6;
  ON_Xform *pOVar7;
  bool bVar8;
  int i_1;
  int i;
  long lVar9;
  byte bVar10;
  ON_SimpleArray<ON_HatchLoop_*> loops;
  ON_Plane hplane;
  ON_HatchLoop *loop;
  ON_Xform xf;
  ON_Xform flatxf;
  ON_Xform local_b0;
  
  bVar10 = 0;
  if (loop_curves->m_count < 1) {
    bVar8 = false;
  }
  else {
    x = loop_curves;
    ON_Xform::ON_Xform(&xf);
    loops._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008224a0;
    loops.m_a = (ON_HatchLoop **)0x0;
    loops.m_count = 0;
    loops.m_capacity = 0;
    bVar8 = false;
    for (lVar9 = 0; lVar9 < loop_curves->m_count; lVar9 = lVar9 + 1) {
      if (loop_curves->m_a[lVar9] == (ON_Curve *)0x0) {
LAB_004b709b:
        for (lVar9 = 0; lVar9 < loops.m_count; lVar9 = lVar9 + 1) {
          pOVar2 = loops.m_a[lVar9];
          if (pOVar2 != (ON_HatchLoop *)0x0) {
            ON_HatchLoop::~ON_HatchLoop(pOVar2);
          }
          ON_HatchLoop::operator_delete(pOVar2,x);
        }
        if (loops.m_a != (ON_HatchLoop **)0x0) {
          memset(loops.m_a,0,(long)loops.m_capacity << 3);
        }
        loops._16_8_ = loops._16_8_ & 0xffffffff00000000;
        goto LAB_004b70e5;
      }
      pCurve2d = (ON_SimpleArray<const_ON_Curve_*> *)ON_Curve::Duplicate(loop_curves->m_a[lVar9]);
      if (pCurve2d == (ON_SimpleArray<const_ON_Curve_*> *)0x0) goto LAB_004b709b;
      iVar1 = (*(((ON_Geometry *)&pCurve2d->_vptr_ON_SimpleArray)->super_ON_Object)._vptr_ON_Object
                [0x18])(pCurve2d);
      if (iVar1 == 3) {
        if (!bVar8) {
          ON_Xform::ON_Xform((ON_Xform *)&loop);
          ON_Xform::ON_Xform(&flatxf);
          pOVar4 = &ON_xy_plane;
          pOVar6 = &hplane;
          for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
            (pOVar6->origin).x = (pOVar4->origin).x;
            pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar10 * -2 + 1) * 8);
            pOVar6 = (ON_Plane *)((long)pOVar6 + (ulong)bVar10 * -0x10 + 8);
          }
          hplane.origin.z = (this->m_plane).origin.z;
          hplane.origin.x = (this->m_plane).origin.x;
          hplane.origin.y = (this->m_plane).origin.y;
          ON_Xform::Rotation((ON_Xform *)&loop,&this->m_plane,&hplane);
          ON_Xform::PlanarProjection(&flatxf,&hplane);
          ON_Xform::operator*(&local_b0,&flatxf,(ON_Xform *)&loop);
          pOVar5 = &local_b0;
          pOVar7 = &xf;
          for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
            pOVar7->m_xform[0][0] = pOVar5->m_xform[0][0];
            pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar10 * -2 + 1) * 8);
            pOVar7 = (ON_Xform *)((long)pOVar7 + ((ulong)bVar10 * -2 + 1) * 8);
          }
          ON_Plane::~ON_Plane(&hplane);
        }
        x = (ON_SimpleArray<const_ON_Curve_*> *)&xf;
        iVar1 = (*(((ON_Geometry *)&pCurve2d->_vptr_ON_SimpleArray)->super_ON_Object).
                  _vptr_ON_Object[0x1c])(pCurve2d);
        if ((char)iVar1 != '\0') {
          x = (ON_SimpleArray<const_ON_Curve_*> *)0x2;
          iVar1 = (*(((ON_Geometry *)&pCurve2d->_vptr_ON_SimpleArray)->super_ON_Object).
                    _vptr_ON_Object[0x28])(pCurve2d);
          bVar8 = true;
          if ((char)iVar1 != '\0') goto LAB_004b6ff2;
        }
        (*(((ON_Geometry *)&pCurve2d->_vptr_ON_SimpleArray)->super_ON_Object)._vptr_ON_Object[4])
                  (pCurve2d);
        goto LAB_004b709b;
      }
LAB_004b6ff2:
      pOVar2 = (ON_HatchLoop *)onmalloc(0x10);
      x = pCurve2d;
      ON_HatchLoop::ON_HatchLoop(pOVar2,(ON_Curve *)pCurve2d,(uint)(loops.m_count != 0));
      loop = pOVar2;
      if (pOVar2 == (ON_HatchLoop *)0x0) {
        (*(((ON_Geometry *)&pCurve2d->_vptr_ON_SimpleArray)->super_ON_Object)._vptr_ON_Object[4])
                  (pCurve2d);
      }
      else {
        x = (ON_SimpleArray<const_ON_Curve_*> *)&loop;
        ON_SimpleArray<ON_HatchLoop_*>::Append(&loops,(ON_HatchLoop **)x);
      }
    }
    bVar8 = 0 < loops.m_count;
    if (loops.m_count < 1) {
LAB_004b70e5:
      bVar8 = false;
    }
    else {
      for (lVar9 = 0; lVar9 < (this->m_loops).m_count; lVar9 = lVar9 + 1) {
        pOVar2 = (this->m_loops).m_a[lVar9];
        if (pOVar2 != (ON_HatchLoop *)0x0) {
          ON_HatchLoop::~ON_HatchLoop(pOVar2);
        }
        ON_HatchLoop::operator_delete(pOVar2,x);
      }
      __s = (this->m_loops).m_a;
      if (__s != (ON_HatchLoop **)0x0) {
        memset(__s,0,(long)(this->m_loops).m_capacity << 3);
      }
      (this->m_loops).m_count = 0;
      lVar9 = 0;
      for (lVar3 = 0; lVar3 < loops.m_count; lVar3 = lVar3 + 1) {
        ON_SimpleArray<ON_HatchLoop_*>::Append
                  (&this->m_loops,(ON_HatchLoop **)((long)loops.m_a + lVar9));
        lVar9 = lVar9 + 8;
      }
    }
    ON_SimpleArray<ON_HatchLoop_*>::~ON_SimpleArray(&loops);
  }
  return bVar8;
}

Assistant:

bool ON_Hatch::ReplaceLoops(ON_SimpleArray<const ON_Curve*>& loop_curves)
{
  if(loop_curves.Count() < 1)
    return false;

  bool rc = true;
  ON_Xform xf;
  bool flat = false;
  ON_SimpleArray<ON_HatchLoop*> loops;

  for(int i = 0; i < loop_curves.Count(); i++)
  {
    if(loop_curves[i] == 0)
    {
      rc = false;
      break;
    }
    ON_Curve* p2d = loop_curves[i]->Duplicate();
    if(p2d == 0)
    {
      rc = false;
      break;
    }
    if(p2d->Dimension() == 3)
    {
      if(!flat)
      {
        ON_Xform planexf, flatxf;
        ON_Plane hplane(ON_xy_plane);
        hplane.origin = m_plane.origin;
        planexf.Rotation(m_plane, hplane);
        flatxf.PlanarProjection(hplane);
        xf = flatxf * planexf;
        flat = true;
      }
      if(!p2d->Transform(xf) ||
         !p2d->ChangeDimension(2))
      {
        delete p2d;
        rc = false;
        break;
      }
    }
    ON_HatchLoop* loop = new ON_HatchLoop(p2d,loops.Count()?ON_HatchLoop::ltInner:ON_HatchLoop::ltOuter);
    if(loop)
      loops.Append(loop);
    else
      delete p2d;
  }
  if(!rc)
  {
    for(int i = 0; i < loops.Count(); i++)
      delete loops[i];

    loops.Empty();
  }

  if(loops.Count() < 1)
    return false;

  for(int i = 0; i < m_loops.Count(); i++)
    delete m_loops[i];
  m_loops.Empty();
  for(int i = 0; i < loops.Count(); i++)
    m_loops.Append(loops[i]);
  return true;
}